

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_avx2_256_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i *palVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  short sVar25;
  int iVar26;
  int iVar27;
  undefined4 uVar28;
  parasail_result_t *ppVar29;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *ptr;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  int16_t *ptr_06;
  long lVar30;
  short sVar31;
  uint uVar32;
  int iVar33;
  long lVar34;
  short sVar35;
  uint uVar36;
  int iVar37;
  int16_t iVar38;
  short sVar39;
  int iVar40;
  ulong uVar41;
  int iVar42;
  undefined2 uVar43;
  ulong uVar44;
  long lVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  uint uVar49;
  undefined2 uVar50;
  undefined2 uVar51;
  undefined2 uVar52;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  __m256i_16_t h;
  undefined1 in_stack_fffffffffffffca0 [16];
  size_t len;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_220 [32];
  undefined1 local_1a0 [32];
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_scan_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar6 = (profile->profile16).score;
    if (pvVar6 == (void *)0x0) {
      parasail_nw_stats_scan_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_scan_profile_avx2_256_16_cold_6();
      }
      else {
        uVar49 = profile->s1Len;
        if ((int)uVar49 < 1) {
          parasail_nw_stats_scan_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_scan_profile_avx2_256_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_scan_profile_avx2_256_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_scan_profile_avx2_256_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_scan_profile_avx2_256_16_cold_1();
        }
        else {
          iVar37 = uVar49 - 1;
          uVar41 = (ulong)uVar49 + 0xf >> 4;
          iVar48 = iVar37 / (int)uVar41;
          uVar49 = iVar37 % (int)uVar41;
          pvVar8 = (profile->profile16).matches;
          iVar46 = -open;
          iVar33 = ppVar7->min;
          iVar40 = -iVar33;
          if (iVar33 != iVar46 && SBORROW4(iVar33,iVar46) == iVar33 + open < 0) {
            iVar40 = open;
          }
          pvVar9 = (profile->profile16).similar;
          sVar25 = 0x7ffe - (short)ppVar7->max;
          ppVar29 = parasail_result_new_stats();
          if (ppVar29 != (parasail_result_t *)0x0) {
            ppVar29->flag = ppVar29->flag | 0x10210401;
            len = uVar41;
            b = parasail_memalign___m256i(0x20,uVar41);
            b_00 = parasail_memalign___m256i(0x20,uVar41);
            b_01 = parasail_memalign___m256i(0x20,uVar41);
            b_02 = parasail_memalign___m256i(0x20,uVar41);
            ptr = parasail_memalign___m256i(0x20,uVar41);
            b_03 = parasail_memalign___m256i(0x20,uVar41);
            b_04 = parasail_memalign___m256i(0x20,uVar41);
            b_05 = parasail_memalign___m256i(0x20,uVar41);
            local_2a0._0_8_ = CONCAT44(0,s2Len);
            ptr_00 = parasail_memalign___m256i(0x20,uVar41);
            ptr_01 = parasail_memalign___m256i(0x20,uVar41);
            ptr_02 = parasail_memalign___m256i(0x20,uVar41);
            ptr_03 = parasail_memalign___m256i(0x20,uVar41);
            ptr_04 = parasail_memalign___m256i(0x20,uVar41);
            ptr_05 = parasail_memalign___m256i(0x20,uVar41);
            ptr_06 = parasail_memalign_int16_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_06 != (int16_t *)0x0 &&
                (ptr_05 != (__m256i *)0x0 && (ptr_04 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0))
                ) && ((ptr_02 != (__m256i *)0x0 &&
                      (ptr_01 != (__m256i *)0x0 &&
                      (ptr_00 != (__m256i *)0x0 && b_05 != (__m256i *)0x0))) &&
                     ((b_04 != (__m256i *)0x0 && (b_03 != (__m256i *)0x0 && ptr != (__m256i *)0x0))
                     && ((b_02 != (__m256i *)0x0 && b_01 != (__m256i *)0x0) &&
                        (b_00 != (__m256i *)0x0 && b != (__m256i *)0x0))))) {
              iVar26 = s2Len + -1;
              iVar27 = 0xf - iVar48;
              uVar50 = (undefined2)open;
              uVar51 = (undefined2)gap;
              uVar52 = (undefined2)(iVar40 - 0x7fffU);
              local_2c0._0_2_ = (undefined2)len;
              local_2c0._2_2_ = local_2c0._0_2_;
              local_2c0._4_2_ = local_2c0._0_2_;
              local_2c0._6_2_ = local_2c0._0_2_;
              local_2c0._8_2_ = local_2c0._0_2_;
              local_2c0._10_2_ = local_2c0._0_2_;
              local_2c0._12_2_ = local_2c0._0_2_;
              local_2c0._14_2_ = local_2c0._0_2_;
              local_2c0._16_2_ = local_2c0._0_2_;
              local_2c0._18_2_ = local_2c0._0_2_;
              local_2c0._20_2_ = local_2c0._0_2_;
              local_2c0._22_2_ = local_2c0._0_2_;
              local_2c0._24_2_ = local_2c0._0_2_;
              local_2c0._26_2_ = local_2c0._0_2_;
              local_2c0._28_2_ = local_2c0._0_2_;
              local_2c0._30_2_ = local_2c0._0_2_;
              auVar54 = vperm2i128_avx2(local_2c0,local_2c0,0x28);
              iVar47 = (int)len * gap;
              auVar53._0_2_ = (undefined2)-iVar47;
              auVar53._2_2_ = auVar53._0_2_;
              auVar53._4_2_ = auVar53._0_2_;
              auVar53._6_2_ = auVar53._0_2_;
              auVar53._8_2_ = auVar53._0_2_;
              auVar53._10_2_ = auVar53._0_2_;
              auVar53._12_2_ = auVar53._0_2_;
              auVar53._14_2_ = auVar53._0_2_;
              auVar53._16_2_ = auVar53._0_2_;
              auVar53._18_2_ = auVar53._0_2_;
              auVar53._20_2_ = auVar53._0_2_;
              auVar53._22_2_ = auVar53._0_2_;
              auVar53._24_2_ = auVar53._0_2_;
              auVar53._26_2_ = auVar53._0_2_;
              auVar53._28_2_ = auVar53._0_2_;
              auVar53._30_2_ = auVar53._0_2_;
              auVar53 = vpand_avx2(auVar53,_DAT_008d4840);
              auVar56 = ZEXT432(iVar40 - 0x7fffU & 0xffff);
              auVar53 = vpaddsw_avx2(auVar56,auVar53);
              alVar2[2] = len;
              alVar2[0] = in_stack_fffffffffffffca0._0_8_;
              alVar2[1] = in_stack_fffffffffffffca0._8_8_;
              alVar2[3] = (longlong)b_02;
              parasail_memset___m256i(b_03,alVar2,len);
              alVar3[2] = len;
              alVar3[0] = in_stack_fffffffffffffca0._0_8_;
              alVar3[1] = in_stack_fffffffffffffca0._8_8_;
              alVar3[3] = (longlong)b_02;
              parasail_memset___m256i(b_04,alVar3,len);
              alVar4[2] = len;
              alVar4[0] = in_stack_fffffffffffffca0._0_8_;
              alVar4[1] = in_stack_fffffffffffffca0._8_8_;
              alVar4[3] = (longlong)b_02;
              parasail_memset___m256i(b_05,alVar4,len);
              alVar5[2] = len;
              alVar5[0] = in_stack_fffffffffffffca0._0_8_;
              alVar5[1] = in_stack_fffffffffffffca0._8_8_;
              alVar5[3] = (longlong)b_02;
              parasail_memset___m256i(b,alVar5,len);
              c[2] = len;
              c[0] = in_stack_fffffffffffffca0._0_8_;
              c[1] = in_stack_fffffffffffffca0._8_8_;
              c[3] = (longlong)b_02;
              parasail_memset___m256i(b_00,c,len);
              c_00[2] = len;
              c_00[0] = in_stack_fffffffffffffca0._0_8_;
              c_00[1] = in_stack_fffffffffffffca0._8_8_;
              c_00[3] = (longlong)b_02;
              parasail_memset___m256i(b_01,c_00,len);
              c_01[2] = len;
              c_01[0] = in_stack_fffffffffffffca0._0_8_;
              c_01[1] = in_stack_fffffffffffffca0._8_8_;
              c_01[3] = (longlong)b_02;
              parasail_memset___m256i(b_02,c_01,len);
              auVar15._2_2_ = uVar51;
              auVar15._0_2_ = uVar51;
              auVar15._4_2_ = uVar51;
              auVar15._6_2_ = uVar51;
              auVar15._8_2_ = uVar51;
              auVar15._10_2_ = uVar51;
              auVar15._12_2_ = uVar51;
              auVar15._14_2_ = uVar51;
              auVar15._16_2_ = uVar51;
              auVar15._18_2_ = uVar51;
              auVar15._20_2_ = uVar51;
              auVar15._22_2_ = uVar51;
              auVar15._24_2_ = uVar51;
              auVar15._26_2_ = uVar51;
              auVar15._28_2_ = uVar51;
              auVar15._30_2_ = uVar51;
              auVar10._2_2_ = uVar50;
              auVar10._0_2_ = uVar50;
              auVar10._4_2_ = uVar50;
              auVar10._6_2_ = uVar50;
              auVar10._8_2_ = uVar50;
              auVar10._10_2_ = uVar50;
              auVar10._12_2_ = uVar50;
              auVar10._14_2_ = uVar50;
              auVar10._16_2_ = uVar50;
              auVar10._18_2_ = uVar50;
              auVar10._20_2_ = uVar50;
              auVar10._22_2_ = uVar50;
              auVar10._24_2_ = uVar50;
              auVar10._26_2_ = uVar50;
              auVar10._28_2_ = uVar50;
              auVar10._30_2_ = uVar50;
              auVar22 = vpsubsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar10);
              iVar33 = (int)len;
              uVar32 = iVar33 - 1;
              lVar30 = (ulong)uVar32 << 5;
              auVar57._8_2_ = 1;
              auVar57._0_8_ = 0x1000100010001;
              auVar57._10_2_ = 1;
              auVar57._12_2_ = 1;
              auVar57._14_2_ = 1;
              auVar57._16_2_ = 1;
              auVar57._18_2_ = 1;
              auVar57._20_2_ = 1;
              auVar57._22_2_ = 1;
              auVar57._24_2_ = 1;
              auVar57._26_2_ = 1;
              auVar57._28_2_ = 1;
              auVar57._30_2_ = 1;
              uVar41 = len & 0xffffffff;
              auVar10 = auVar57;
              do {
                *(undefined1 (*) [32])((long)*ptr_04 + lVar30) = auVar22;
                *(undefined1 (*) [32])((long)*ptr_05 + lVar30) = auVar10;
                auVar22 = vpsubsw_avx2(auVar22,auVar15);
                auVar10 = vpaddsw_avx2(auVar10,auVar57);
                lVar30 = lVar30 + -0x20;
                iVar40 = (int)uVar41;
                uVar36 = iVar40 - 1;
                uVar41 = (ulong)uVar36;
              } while (uVar36 != 0 && 0 < iVar40);
              uVar41 = 0;
              iVar40 = iVar46;
              do {
                lVar30 = 0;
                iVar42 = iVar40;
                do {
                  uVar43 = 0x8000;
                  if (-0x8000 < iVar42) {
                    uVar43 = (undefined2)iVar42;
                  }
                  *(undefined2 *)((long)&local_80 + lVar30 * 2) = uVar43;
                  lVar30 = lVar30 + 1;
                  iVar42 = iVar42 - iVar47;
                } while (lVar30 != 0x10);
                palVar1 = ptr + uVar41;
                (*palVar1)[0] = local_80;
                (*palVar1)[1] = lStack_78;
                (*palVar1)[2] = lStack_70;
                (*palVar1)[3] = lStack_68;
                uVar41 = uVar41 + 1;
                iVar40 = iVar40 - gap;
              } while (uVar41 != (len & 0xffffffff));
              *ptr_06 = 0;
              uVar41 = 1;
              do {
                iVar38 = -0x8000;
                if (-0x8000 < iVar46) {
                  iVar38 = (int16_t)iVar46;
                }
                ptr_06[uVar41] = iVar38;
                uVar41 = uVar41 + 1;
                iVar46 = iVar46 - gap;
              } while (s2Len + 1 != uVar41);
              auVar10 = vpalignr_avx2(local_2c0,auVar54,0xe);
              uVar41 = 1;
              if (1 < s2Len) {
                uVar41 = CONCAT44(0,s2Len);
              }
              lVar30 = (ulong)(iVar33 + (uint)(iVar33 == 0)) << 5;
              uVar44 = 0;
              auVar54._8_2_ = 1;
              auVar54._0_8_ = 0x1000100010001;
              auVar54._10_2_ = 1;
              auVar54._12_2_ = 1;
              auVar54._14_2_ = 1;
              auVar54._16_2_ = 1;
              auVar54._18_2_ = 1;
              auVar54._20_2_ = 1;
              auVar54._22_2_ = 1;
              auVar54._24_2_ = 1;
              auVar54._26_2_ = 1;
              auVar54._28_2_ = 1;
              auVar54._30_2_ = 1;
              local_1a0._2_2_ = uVar52;
              local_1a0._0_2_ = uVar52;
              local_1a0._4_2_ = uVar52;
              local_1a0._6_2_ = uVar52;
              local_1a0._10_2_ = uVar52;
              local_1a0._8_2_ = uVar52;
              local_1a0._12_2_ = uVar52;
              local_1a0._14_2_ = uVar52;
              local_1a0._18_2_ = uVar52;
              local_1a0._16_2_ = uVar52;
              local_1a0._20_2_ = uVar52;
              local_1a0._22_2_ = uVar52;
              local_1a0._26_2_ = uVar52;
              local_1a0._24_2_ = uVar52;
              local_1a0._28_2_ = uVar52;
              local_1a0._30_2_ = uVar52;
              auVar65 = ZEXT3264(CONCAT230(sVar25,CONCAT228(sVar25,CONCAT226(sVar25,CONCAT224(sVar25
                                                  ,CONCAT222(sVar25,CONCAT220(sVar25,CONCAT218(
                                                  sVar25,CONCAT216(sVar25,CONCAT214(sVar25,CONCAT212
                                                  (sVar25,CONCAT210(sVar25,CONCAT28(sVar25,CONCAT26(
                                                  sVar25,CONCAT24(sVar25,CONCAT22(sVar25,sVar25)))))
                                                  )))))))))));
              auVar22 = auVar54;
              do {
                alVar2 = b_03[uVar32];
                alVar3 = b_04[uVar32];
                alVar4 = b_05[uVar32];
                auVar55 = SUB3216(ptr[uVar32],0);
                auVar62._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar22._0_16_;
                auVar62._16_16_ = ZEXT116(0) * auVar22._16_16_ + ZEXT116(1) * auVar55;
                auVar15 = vpalignr_avx2((undefined1  [32])ptr[uVar32],auVar62,0xe);
                auVar57 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
                auVar57 = vpalignr_avx2((undefined1  [32])alVar2,auVar57,0xe);
                auVar62 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                auVar62 = vpalignr_avx2((undefined1  [32])alVar3,auVar62,0xe);
                auVar58 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,0x28);
                auVar55 = vpinsrw_avx(auVar15._0_16_,(uint)(ushort)ptr_06[uVar44],0);
                auVar58 = vpalignr_avx2((undefined1  [32])alVar4,auVar58,0xe);
                auVar15 = vpblendd_avx2(auVar15,ZEXT1632(auVar55),0xf);
                lVar45 = (long)ppVar7->mapper[(byte)s2[uVar44]] * (len & 0xffffffff) * 0x20;
                auVar21._2_2_ = uVar52;
                auVar21._0_2_ = uVar52;
                auVar21._4_2_ = uVar52;
                auVar21._6_2_ = uVar52;
                auVar21._8_2_ = uVar52;
                auVar21._10_2_ = uVar52;
                auVar21._12_2_ = uVar52;
                auVar21._14_2_ = uVar52;
                auVar21._16_2_ = uVar52;
                auVar21._18_2_ = uVar52;
                auVar21._20_2_ = uVar52;
                auVar21._22_2_ = uVar52;
                auVar21._24_2_ = uVar52;
                auVar21._26_2_ = uVar52;
                auVar21._28_2_ = uVar52;
                auVar21._30_2_ = uVar52;
                auVar23 = vpsubsw_avx2(auVar21,(undefined1  [32])*ptr_04);
                local_220 = ZEXT1632(ZEXT816(0));
                lVar34 = 0;
                auVar63 = ZEXT1664((undefined1  [16])0x0);
                auVar64 = ZEXT1664((undefined1  [16])0x0);
                do {
                  auVar11 = vpaddsw_avx2(auVar15,*(undefined1 (*) [32])
                                                  ((long)pvVar6 + lVar34 + lVar45));
                  auVar12 = vpaddsw_avx2(auVar57,*(undefined1 (*) [32])
                                                  ((long)pvVar8 + lVar34 + lVar45));
                  auVar15 = *(undefined1 (*) [32])((long)*ptr + lVar34);
                  auVar57 = *(undefined1 (*) [32])((long)*b_03 + lVar34);
                  auVar13 = vpaddsw_avx2(auVar62,*(undefined1 (*) [32])
                                                  ((long)pvVar9 + lVar34 + lVar45));
                  auVar62 = *(undefined1 (*) [32])((long)*b_04 + lVar34);
                  auVar23 = vpaddsw_avx2(auVar23,*(undefined1 (*) [32])((long)*ptr_04 + lVar34));
                  auVar14 = vpaddsw_avx2(auVar58,auVar54);
                  auVar58 = *(undefined1 (*) [32])((long)*b_05 + lVar34);
                  auVar18 = vpcmpgtw_avx2(auVar23,auVar21);
                  auVar16 = vpblendvb_avx2(auVar64._0_32_,auVar22,auVar18);
                  auVar17 = vpblendvb_avx2(auVar63._0_32_,local_2c0,auVar18);
                  auVar22 = vpaddsw_avx2(local_2a0,*(undefined1 (*) [32])((long)*ptr_05 + lVar34));
                  local_220 = vpblendvb_avx2(local_220,auVar22,auVar18);
                  auVar22._2_2_ = uVar50;
                  auVar22._0_2_ = uVar50;
                  auVar22._4_2_ = uVar50;
                  auVar22._6_2_ = uVar50;
                  auVar22._8_2_ = uVar50;
                  auVar22._10_2_ = uVar50;
                  auVar22._12_2_ = uVar50;
                  auVar22._14_2_ = uVar50;
                  auVar22._16_2_ = uVar50;
                  auVar22._18_2_ = uVar50;
                  auVar22._20_2_ = uVar50;
                  auVar22._22_2_ = uVar50;
                  auVar22._24_2_ = uVar50;
                  auVar22._26_2_ = uVar50;
                  auVar22._28_2_ = uVar50;
                  auVar22._30_2_ = uVar50;
                  auVar22 = vpsubsw_avx2(auVar15,auVar22);
                  auVar18._2_2_ = uVar51;
                  auVar18._0_2_ = uVar51;
                  auVar18._4_2_ = uVar51;
                  auVar18._6_2_ = uVar51;
                  auVar18._8_2_ = uVar51;
                  auVar18._10_2_ = uVar51;
                  auVar18._12_2_ = uVar51;
                  auVar18._14_2_ = uVar51;
                  auVar18._16_2_ = uVar51;
                  auVar18._18_2_ = uVar51;
                  auVar18._20_2_ = uVar51;
                  auVar18._22_2_ = uVar51;
                  auVar18._24_2_ = uVar51;
                  auVar18._26_2_ = uVar51;
                  auVar18._28_2_ = uVar51;
                  auVar18._30_2_ = uVar51;
                  auVar24 = vpsubsw_avx2(*(undefined1 (*) [32])((long)*b + lVar34),auVar18);
                  auVar18 = vpcmpgtw_avx2(auVar22,auVar24);
                  auVar20 = vpmaxsw_avx2(auVar22,auVar24);
                  auVar22 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_00 + lVar34),auVar57,
                                           auVar18);
                  auVar24 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_01 + lVar34),auVar62,
                                           auVar18);
                  auVar18 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_02 + lVar34),auVar58,
                                           auVar18);
                  auVar18 = vpaddsw_avx2(auVar18,auVar54);
                  auVar19 = vpcmpgtw_avx2(auVar20,auVar11);
                  *(undefined1 (*) [32])((long)*b + lVar34) = auVar20;
                  *(undefined1 (*) [32])((long)*b_00 + lVar34) = auVar22;
                  auVar22 = vpblendvb_avx2(auVar12,auVar22,auVar19);
                  *(undefined1 (*) [32])((long)*b_01 + lVar34) = auVar24;
                  local_2c0 = vpblendvb_avx2(auVar13,auVar24,auVar19);
                  local_2a0 = vpblendvb_avx2(auVar14,auVar18,auVar19);
                  *(undefined1 (*) [32])((long)*b_02 + lVar34) = auVar18;
                  auVar63 = ZEXT3264(auVar17);
                  auVar64 = ZEXT3264(auVar16);
                  auVar21 = vpmaxsw_avx2(auVar21,auVar23);
                  auVar23 = vpmaxsw_avx2(auVar20,auVar11);
                  *(undefined1 (*) [32])((long)*ptr + lVar34) = auVar11;
                  *(undefined1 (*) [32])((long)*b_03 + lVar34) = auVar12;
                  *(undefined1 (*) [32])((long)*b_04 + lVar34) = auVar13;
                  *(undefined1 (*) [32])((long)*b_05 + lVar34) = auVar14;
                  lVar34 = lVar34 + 0x20;
                } while (lVar30 != lVar34);
                auVar15 = vperm2i128_avx2(auVar22,auVar22,0x28);
                auVar22 = vpalignr_avx2(auVar22,auVar15,0xe);
                auVar15 = vperm2i128_avx2(local_2c0,local_2c0,0x28);
                local_2c0 = vpalignr_avx2(local_2c0,auVar15,0xe);
                auVar57 = vperm2i128_avx2(local_2a0,local_2a0,0x28);
                auVar58._0_16_ = ZEXT116(0) * auVar23._0_16_ + ZEXT116(1) * auVar22._0_16_;
                auVar58._16_16_ = ZEXT116(0) * auVar22._16_16_ + ZEXT116(1) * auVar23._0_16_;
                auVar15 = vpalignr_avx2(auVar23,auVar58,0xe);
                auVar55 = vpinsrw_avx(auVar15._0_16_,(uint)(ushort)ptr_06[uVar44 + 1],0);
                local_2a0 = vpalignr_avx2(local_2a0,auVar57,0xe);
                auVar23 = vpblendd_avx2(auVar15,ZEXT1632(auVar55),0xf);
                auVar15 = vpaddsw_avx2(auVar23,(undefined1  [32])*ptr_04);
                auVar58 = vpcmpgtw_avx2(auVar21,auVar15);
                auVar21 = vpmaxsw_avx2(auVar21,auVar15);
                auVar62 = vpblendvb_avx2(auVar22,auVar16,auVar58);
                auVar57 = vpblendvb_avx2(local_2c0,auVar17,auVar58);
                auVar15 = vpaddsw_avx2(local_2a0,(undefined1  [32])*ptr_05);
                uVar44 = uVar44 + 1;
                auVar15 = vpblendvb_avx2(auVar15,local_220,auVar58);
                iVar33 = 0xe;
                do {
                  auVar12 = vperm2i128_avx2(auVar15,auVar15,0x28);
                  auVar13 = vperm2i128_avx2(auVar57,auVar57,0x28);
                  auVar14 = vperm2i128_avx2(auVar62,auVar62,0x28);
                  auVar58 = vperm2i128_avx2(auVar21,auVar21,0x28);
                  auVar58 = vpalignr_avx2(auVar21,auVar58,0xe);
                  auVar58 = vpaddsw_avx2(auVar58,auVar53);
                  auVar11 = vpcmpgtw_avx2(auVar21,auVar58);
                  auVar21 = vpmaxsw_avx2(auVar21,auVar58);
                  auVar58 = vpalignr_avx2(auVar62,auVar14,0xe);
                  auVar62 = vpblendvb_avx2(auVar58,auVar62,auVar11);
                  auVar58 = vpalignr_avx2(auVar57,auVar13,0xe);
                  auVar57 = vpblendvb_avx2(auVar58,auVar57,auVar11);
                  auVar58 = vpalignr_avx2(auVar15,auVar12,0xe);
                  auVar58 = vpaddsw_avx2(auVar10,auVar58);
                  auVar15 = vpblendvb_avx2(auVar58,auVar15,auVar11);
                  iVar33 = iVar33 + -1;
                } while (iVar33 != 0);
                auVar11 = vperm2i128_avx2(auVar21,auVar21,0x28);
                auVar58 = vperm2i128_avx2(auVar62,auVar62,0x28);
                auVar62 = vpalignr_avx2(auVar62,auVar58,0xe);
                auVar58 = vperm2i128_avx2(auVar57,auVar57,0x28);
                auVar58 = vpalignr_avx2(auVar57,auVar58,0xe);
                auVar57 = vperm2i128_avx2(auVar15,auVar15,0x28);
                auVar57 = vpalignr_avx2(auVar15,auVar57,0xe);
                auVar15 = vpalignr_avx2(auVar21,auVar11,0xe);
                auVar15 = vpaddsw_avx2(auVar15,auVar56);
                auVar21 = vpcmpgtw_avx2(auVar15,auVar23);
                auVar12 = vpblendvb_avx2(auVar22,auVar62,auVar21);
                auVar11 = vpblendvb_avx2(local_2c0,auVar58,auVar21);
                auVar23 = vpmaxsw_avx2(auVar15,auVar23);
                auVar21 = vpblendvb_avx2(local_2a0,auVar57,auVar21);
                lVar34 = 0;
                auVar65 = ZEXT3264(auVar65._0_32_);
                do {
                  auVar13 = *(undefined1 (*) [32])((long)*ptr + lVar34);
                  auVar14._2_2_ = uVar50;
                  auVar14._0_2_ = uVar50;
                  auVar14._4_2_ = uVar50;
                  auVar14._6_2_ = uVar50;
                  auVar14._8_2_ = uVar50;
                  auVar14._10_2_ = uVar50;
                  auVar14._12_2_ = uVar50;
                  auVar14._14_2_ = uVar50;
                  auVar14._16_2_ = uVar50;
                  auVar14._18_2_ = uVar50;
                  auVar14._20_2_ = uVar50;
                  auVar14._22_2_ = uVar50;
                  auVar14._24_2_ = uVar50;
                  auVar14._26_2_ = uVar50;
                  auVar14._28_2_ = uVar50;
                  auVar14._30_2_ = uVar50;
                  auVar23 = vpsubsw_avx2(auVar23,auVar14);
                  auVar16._2_2_ = uVar51;
                  auVar16._0_2_ = uVar51;
                  auVar16._4_2_ = uVar51;
                  auVar16._6_2_ = uVar51;
                  auVar16._8_2_ = uVar51;
                  auVar16._10_2_ = uVar51;
                  auVar16._12_2_ = uVar51;
                  auVar16._14_2_ = uVar51;
                  auVar16._16_2_ = uVar51;
                  auVar16._18_2_ = uVar51;
                  auVar16._20_2_ = uVar51;
                  auVar16._22_2_ = uVar51;
                  auVar16._24_2_ = uVar51;
                  auVar16._26_2_ = uVar51;
                  auVar16._28_2_ = uVar51;
                  auVar16._30_2_ = uVar51;
                  auVar14 = vpsubsw_avx2(auVar15,auVar16);
                  auVar15 = vpcmpgtw_avx2(auVar23,auVar14);
                  auVar62 = vpblendvb_avx2(auVar62,auVar12,auVar15);
                  auVar58 = vpblendvb_avx2(auVar58,auVar11,auVar15);
                  auVar57 = vpblendvb_avx2(auVar57,auVar21,auVar15);
                  auVar15 = vpmaxsw_avx2(auVar23,auVar14);
                  auVar21 = vpmaxsw_avx2(auVar13,*(undefined1 (*) [32])((long)*b + lVar34));
                  auVar23 = vpmaxsw_avx2(auVar15,auVar21);
                  auVar14 = vpcmpgtw_avx2(auVar21,auVar15);
                  auVar21 = vpblendvb_avx2(auVar62,*(undefined1 (*) [32])((long)*b_00 + lVar34),
                                           auVar14);
                  auVar13 = vpcmpeqw_avx2(auVar23,auVar13);
                  auVar12 = vpblendvb_avx2(auVar21,*(undefined1 (*) [32])((long)*b_03 + lVar34),
                                           auVar13);
                  auVar21 = vpblendvb_avx2(auVar58,*(undefined1 (*) [32])((long)*b_01 + lVar34),
                                           auVar14);
                  auVar11 = vpblendvb_avx2(auVar21,*(undefined1 (*) [32])((long)*b_04 + lVar34),
                                           auVar13);
                  auVar57 = vpaddsw_avx2(auVar57,auVar54);
                  auVar21 = vpblendvb_avx2(auVar57,*(undefined1 (*) [32])((long)*b_02 + lVar34),
                                           auVar14);
                  auVar21 = vpblendvb_avx2(auVar21,*(undefined1 (*) [32])((long)*b_05 + lVar34),
                                           auVar13);
                  *(undefined1 (*) [32])((long)*ptr + lVar34) = auVar23;
                  *(undefined1 (*) [32])((long)*b_03 + lVar34) = auVar12;
                  *(undefined1 (*) [32])((long)*b_04 + lVar34) = auVar11;
                  *(undefined1 (*) [32])((long)*b_05 + lVar34) = auVar21;
                  auVar18 = vpminsw_avx2(auVar65._0_32_,auVar23);
                  auVar65 = ZEXT3264(auVar18);
                  auVar13 = vpmaxsw_avx2(auVar23,local_1a0);
                  auVar13 = vpmaxsw_avx2(auVar12,auVar13);
                  auVar14 = vpmaxsw_avx2(auVar11,auVar21);
                  local_1a0 = vpmaxsw_avx2(auVar13,auVar14);
                  lVar34 = lVar34 + 0x20;
                } while (lVar30 != lVar34);
              } while (uVar44 != uVar41);
              alVar2 = ptr[uVar49];
              auVar55 = alVar2._16_16_;
              alVar3 = b_03[uVar49];
              auVar61 = alVar3._16_16_;
              alVar4 = b_04[uVar49];
              auVar60 = alVar4._16_16_;
              alVar5 = b_05[uVar49];
              auVar59 = alVar5._16_16_;
              if (iVar48 < 0xf) {
                iVar33 = 1;
                if (1 < iVar27) {
                  iVar33 = iVar27;
                }
                do {
                  auVar53 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
                  alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar53,0xe);
                  auVar55 = alVar2._16_16_;
                  auVar53 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                  alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar53,0xe);
                  auVar61 = alVar3._16_16_;
                  auVar53 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,0x28);
                  alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar53,0xe);
                  auVar60 = alVar4._16_16_;
                  auVar53 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,0x28);
                  alVar5 = (__m256i)vpalignr_avx2((undefined1  [32])alVar5,auVar53,0xe);
                  auVar59 = alVar5._16_16_;
                  iVar33 = iVar33 + -1;
                } while (iVar33 != 0);
              }
              auVar56._2_2_ = uVar52;
              auVar56._0_2_ = uVar52;
              auVar56._4_2_ = uVar52;
              auVar56._6_2_ = uVar52;
              auVar56._8_2_ = uVar52;
              auVar56._10_2_ = uVar52;
              auVar56._12_2_ = uVar52;
              auVar56._14_2_ = uVar52;
              auVar56._16_2_ = uVar52;
              auVar56._18_2_ = uVar52;
              auVar56._20_2_ = uVar52;
              auVar56._22_2_ = uVar52;
              auVar56._24_2_ = uVar52;
              auVar56._26_2_ = uVar52;
              auVar56._28_2_ = uVar52;
              auVar56._30_2_ = uVar52;
              auVar53 = vpcmpgtw_avx2(auVar56,auVar18);
              auVar23._2_2_ = sVar25;
              auVar23._0_2_ = sVar25;
              auVar23._4_2_ = sVar25;
              auVar23._6_2_ = sVar25;
              auVar23._8_2_ = sVar25;
              auVar23._10_2_ = sVar25;
              auVar23._12_2_ = sVar25;
              auVar23._14_2_ = sVar25;
              auVar23._16_2_ = sVar25;
              auVar23._18_2_ = sVar25;
              auVar23._20_2_ = sVar25;
              auVar23._22_2_ = sVar25;
              auVar23._24_2_ = sVar25;
              auVar23._26_2_ = sVar25;
              auVar23._28_2_ = sVar25;
              auVar23._30_2_ = sVar25;
              auVar10 = vpcmpgtw_avx2(local_1a0,auVar23);
              auVar53 = vpor_avx2(auVar10,auVar53);
              if ((((((((((((((((((((((((((((((((auVar53 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (auVar53 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar53 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar53 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar53 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar53 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar53 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar53 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar53 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar53 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar53 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar53 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar53 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar53 >> 0x6f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar53 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar53 >> 0x7f,0) == '\0') &&
                                (auVar53 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar53 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar53 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar53 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar53 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar53 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar53 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar53 >> 0xbf,0) == '\0') &&
                        (auVar53 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar53 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar53 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar53 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar53 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar53 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar53 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < auVar53[0x1f]) {
                uVar28 = vpextrw_avx(auVar55,7);
                sVar25 = (short)uVar28;
                uVar28 = vpextrw_avx(auVar61,7);
                sVar31 = (short)uVar28;
                uVar28 = vpextrw_avx(auVar60,7);
                sVar35 = (short)uVar28;
                uVar28 = vpextrw_avx(auVar59,7);
                sVar39 = (short)uVar28;
              }
              else {
                *(byte *)&ppVar29->flag = (byte)ppVar29->flag | 0x40;
                sVar25 = 0;
                sVar31 = 0;
                sVar35 = 0;
                sVar39 = 0;
                iVar26 = 0;
                iVar37 = 0;
              }
              ppVar29->score = (int)sVar25;
              ppVar29->end_query = iVar37;
              ppVar29->end_ref = iVar26;
              *(int *)(ppVar29->field_4).extra = (int)sVar31;
              ((ppVar29->field_4).stats)->similar = (int)sVar35;
              ((ppVar29->field_4).stats)->length = (int)sVar39;
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar29;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile16.score;
    pvPm = (__m256i*)profile->profile16.matches;
    pvPs = (__m256i*)profile->profile16.similar;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi16(segLen), 2);
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int16_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
            vGapperL = _mm256_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        vHpM = _mm256_slli_si256_rpl(vHpM, 2);
        vHpS = _mm256_slli_si256_rpl(vHpS, 2);
        vHpL = _mm256_slli_si256_rpl(vHpL, 2);
        vHp = _mm256_insert_epi16_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_subs_epi16(vH, vGapO);
            vE_ext = _mm256_subs_epi16(vE, vGapE);
            case1 = _mm256_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm256_max_epi16(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_adds_epi16(vEL, vOne);
            vGapper = _mm256_adds_epi16(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vF, vGapper),
                    _mm256_cmpeq_epi16(vF, vGapper));
            vF = _mm256_max_epi16(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_adds_epi16(vHp, vW);
            vHpM = _mm256_adds_epi16(vHpM, vWM);
            vHpS = _mm256_adds_epi16(vHpS, vWS);
            vHpL = _mm256_adds_epi16(vHpL, vOne);
            case1 = _mm256_cmpgt_epi16(vE, vHp);
            vHt = _mm256_max_epi16(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vHtM = _mm256_slli_si256_rpl(vHtM, 2);
        vHtS = _mm256_slli_si256_rpl(vHtS, 2);
        vHtL = _mm256_slli_si256_rpl(vHtL, 2);
        vHt = _mm256_insert_epi16_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_adds_epi16(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi16(vGapper, vF),
                _mm256_cmpeq_epi16(vGapper, vF));
        vF = _mm256_max_epi16(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 2);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 2);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vFt, vF),
                    _mm256_cmpeq_epi16(vFt, vF));
            vF = _mm256_max_epi16(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vFM = _mm256_slli_si256_rpl(vFM, 2);
        vFS = _mm256_slli_si256_rpl(vFS, 2);
        vFL = _mm256_slli_si256_rpl(vFL, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi16(vF, vHt);
        vH = _mm256_max_epi16(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_subs_epi16(vH, vGapO);
            vF_ext = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_adds_epi16(vFL, vOne);
            vH = _mm256_max_epi16(vHp, vE);
            vH = _mm256_max_epi16(vH, vF);
            case1 = _mm256_cmpeq_epi16(vH, vHp);
            case2 = _mm256_cmpeq_epi16(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
                vHM = _mm256_slli_si256_rpl(vHM, 2);
                vHS = _mm256_slli_si256_rpl(vHS, 2);
                vHL = _mm256_slli_si256_rpl(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
            result->stats->rowcols->length_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 2);
            vHM = _mm256_slli_si256_rpl(vHM, 2);
            vHS = _mm256_slli_si256_rpl(vHS, 2);
            vHL = _mm256_slli_si256_rpl(vHL, 2);
        }
        score = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
        matches = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
        similar = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
        length = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}